

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool __thiscall ImGuiListClipper::Step(ImGuiListClipper *this)

{
  ImVector<ImGuiListClipperRange> *this_00;
  long lVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  ImGuiWindow *window;
  void *pvVar6;
  ImGuiTable *table;
  long lVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [12];
  ImGuiContext *pIVar11;
  long lVar12;
  int i;
  bool *pbVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  uint off_max;
  int iVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  ImGuiListClipperRange *pIVar22;
  bool bVar23;
  float fVar24;
  ImRect IVar25;
  ImGuiListClipperRange local_48;
  int local_38;
  float local_34;
  
  pIVar11 = GImGui;
  local_34 = this->ItemsHeight;
  window = GImGui->CurrentWindow;
  pvVar6 = this->TempData;
  table = GImGui->CurrentTable;
  if ((table != (ImGuiTable *)0x0) && (table->IsInsideRow == true)) {
    ImGui::TableEndRow(table);
  }
  iVar18 = this->ItemsCount;
  if (iVar18 != 0) {
    if (GImGui->CurrentTable == (ImGuiTable *)0x0) {
      pbVar13 = &GImGui->CurrentWindow->SkipItems;
    }
    else {
      pbVar13 = &GImGui->CurrentTable->HostSkipItems;
    }
    if (*pbVar13 == false) {
      iVar20 = *(int *)((long)pvVar6 + 0xc);
      if (iVar20 == 0 && table != (ImGuiTable *)0x0) {
        if (table->IsUnfrozenRows == true) {
          fVar24 = this->ItemsHeight;
LAB_001bb868:
          this->StartPosY = (window->DC).CursorPos.y;
          if (0.0 < fVar24) {
            iVar17 = this->DisplayEnd;
LAB_001bb978:
            if (pIVar11->LogEnabled == true) {
              auVar10[4] = local_48.PosToIndexConvert;
              auVar10[5] = local_48.PosToIndexOffsetMin;
              auVar10[6] = local_48.PosToIndexOffsetMax;
              auVar10[7] = local_48._11_1_;
              auVar10._0_4_ = iVar18;
              auVar10._8_4_ = 0;
              local_48 = (ImGuiListClipperRange)(auVar10 << 0x20);
              local_48.PosToIndexConvert = false;
              local_48.PosToIndexOffsetMin = '\0';
              local_48.PosToIndexOffsetMax = '\0';
              local_48._11_1_ = 0;
            }
            else {
              if (((pIVar11->NavMoveScoringItems == true) &&
                  (pIVar11->NavWindow != (ImGuiWindow *)0x0)) &&
                 (pIVar11->NavWindow->RootWindowForNav == window->RootWindowForNav)) {
                local_48.Max = (int)(pIVar11->NavScoringNoClipRect).Max.y;
                local_48.Min = (int)(pIVar11->NavScoringNoClipRect).Min.y;
                local_48.PosToIndexConvert = true;
                local_48.PosToIndexOffsetMin = '\0';
                local_48.PosToIndexOffsetMax = '\0';
                local_48._11_1_ = 0;
                ImVector<ImGuiListClipperRange>::push_back
                          ((ImVector<ImGuiListClipperRange> *)((long)pvVar6 + 0x18),&local_48);
                bVar23 = true;
                if (((pIVar11->NavMoveFlags & 0x400) != 0) && (pIVar11->NavTabbingDir == -1)) {
                  local_48.Max = this->ItemsCount;
                  local_48.Min = this->ItemsCount + -1;
                  local_48.PosToIndexConvert = false;
                  local_48.PosToIndexOffsetMin = '\0';
                  local_48.PosToIndexOffsetMax = '\0';
                  local_48._11_1_ = 0;
                  ImVector<ImGuiListClipperRange>::push_back
                            ((ImVector<ImGuiListClipperRange> *)((long)pvVar6 + 0x18),&local_48);
                }
              }
              else {
                bVar23 = false;
              }
              IVar25 = ImGui::WindowRectRelToAbs(window,window->NavRectRel);
              if ((pIVar11->NavId != 0) && (window->NavLastIds[0] == pIVar11->NavId)) {
                local_48.Max = (int)IVar25.Max.y;
                local_48.Min = (int)IVar25.Min.y;
                local_48.PosToIndexConvert = true;
                local_48.PosToIndexOffsetMin = '\0';
                local_48.PosToIndexOffsetMax = '\0';
                local_48._11_1_ = 0;
                ImVector<ImGuiListClipperRange>::push_back
                          ((ImVector<ImGuiListClipperRange> *)((long)pvVar6 + 0x18),&local_48);
              }
              iVar18 = 0;
              off_max = 0;
              if (bVar23) {
                iVar18 = -(uint)(pIVar11->NavMoveClipDir == 2);
                off_max = (uint)(pIVar11->NavMoveClipDir == 3);
              }
              local_48 = ImGuiListClipperRange::FromPositions
                                   ((window->ClipRect).Min.y,(window->ClipRect).Max.y,iVar18,off_max
                                   );
            }
            ImVector<ImGuiListClipperRange>::push_back
                      ((ImVector<ImGuiListClipperRange> *)((long)pvVar6 + 0x18),&local_48);
            this_00 = (ImVector<ImGuiListClipperRange> *)((long)pvVar6 + 0x18);
            lVar12 = 8;
            for (lVar14 = 0; iVar18 = this_00->Size, lVar14 < iVar18; lVar14 = lVar14 + 1) {
              lVar21 = *(long *)((long)pvVar6 + 0x20);
              if (*(char *)(lVar21 + lVar12) == '\x01') {
                fVar24 = (window->DC).CursorPos.y;
                fVar2 = *(float *)((long)pvVar6 + 8);
                fVar3 = this->ItemsHeight;
                iVar20 = *(char *)(lVar21 + 1 + lVar12) + iVar17 +
                         (int)((((float)*(int *)(lVar21 + -8 + lVar12) - fVar24) - fVar2) / fVar3);
                iVar18 = this->ItemsCount + -1;
                if (iVar20 < iVar18) {
                  iVar18 = iVar20;
                }
                if (iVar20 < iVar17) {
                  iVar18 = iVar17;
                }
                *(int *)(lVar21 + -8 + lVar12) = iVar18;
                lVar7 = *(long *)((long)pvVar6 + 0x20);
                iVar19 = *(char *)(lVar7 + 2 + lVar12) + iVar17 +
                         (int)((((float)*(int *)(lVar21 + -4 + lVar12) - fVar24) - fVar2) / fVar3 +
                              0.999999);
                iVar18 = *(int *)(lVar7 + -8 + lVar12);
                iVar20 = this->ItemsCount;
                if (iVar19 < this->ItemsCount) {
                  iVar20 = iVar19;
                }
                if (iVar19 <= iVar18) {
                  iVar20 = iVar18 + 1;
                }
                *(int *)(lVar7 + -4 + lVar12) = iVar20;
                *(undefined1 *)(*(long *)((long)pvVar6 + 0x20) + lVar12) = 0;
              }
              lVar12 = lVar12 + 0xc;
            }
            iVar20 = *(int *)((long)pvVar6 + 0xc);
            if (1 < iVar18 - iVar20) {
              lVar12 = (long)iVar20;
              uVar15 = (ulong)(uint)(iVar18 - iVar20);
              while (local_38 = iVar17, 1 < (long)uVar15) {
                uVar15 = uVar15 - 1;
                lVar14 = lVar12 * 0xc;
                for (lVar21 = lVar12; lVar21 < (long)(uVar15 + lVar12); lVar21 = lVar21 + 1) {
                  lVar7 = *(long *)((long)pvVar6 + 0x20);
                  if (*(int *)(lVar7 + 0xc + lVar14) < *(int *)(lVar7 + lVar14)) {
                    lVar1 = lVar7 + lVar14;
                    pIVar22 = (ImGuiListClipperRange *)(lVar7 + lVar14);
                    uVar4 = *(undefined4 *)&pIVar22->PosToIndexConvert;
                    uVar8 = *(undefined8 *)pIVar22;
                    local_48 = *pIVar22;
                    uVar5 = *(undefined4 *)(lVar1 + 0x14);
                    pIVar22->PosToIndexConvert = (bool)(char)uVar5;
                    pIVar22->PosToIndexOffsetMin = (char)((uint)uVar5 >> 8);
                    pIVar22->PosToIndexOffsetMax = (char)((uint)uVar5 >> 0x10);
                    pIVar22->field_0xb = (char)((uint)uVar5 >> 0x18);
                    uVar9 = *(undefined8 *)(lVar1 + 0xc);
                    pIVar22->Min = (int)uVar9;
                    pIVar22->Max = (int)((ulong)uVar9 >> 0x20);
                    *(undefined4 *)(lVar1 + 0x14) = uVar4;
                    *(undefined8 *)(lVar1 + 0xc) = uVar8;
                  }
                  lVar14 = lVar14 + 0xc;
                }
              }
              do {
                lVar12 = (long)iVar20;
                iVar20 = iVar20 + 1;
                lVar12 = lVar12 * 0xc;
                lVar14 = (long)iVar20 * 0xc;
                while( true ) {
                  iVar18 = this_00->Size;
                  if (iVar18 <= iVar20) {
                    iVar20 = *(int *)((long)pvVar6 + 0xc);
                    iVar17 = local_38;
                    goto LAB_001bbc38;
                  }
                  lVar21 = *(long *)((long)pvVar6 + 0x20);
                  iVar18 = *(int *)(lVar21 + lVar14);
                  if (*(int *)(lVar21 + 4 + lVar12) < iVar18) break;
                  iVar17 = *(int *)(lVar21 + lVar12);
                  if (iVar17 < iVar18) {
                    iVar18 = iVar17;
                  }
                  *(int *)(lVar21 + lVar12) = iVar18;
                  lVar21 = *(long *)((long)pvVar6 + 0x20);
                  iVar18 = *(int *)(lVar21 + 4 + lVar12);
                  iVar17 = *(int *)(lVar21 + 4 + lVar14);
                  if (iVar17 < iVar18) {
                    iVar17 = iVar18;
                  }
                  *(int *)(lVar21 + 4 + lVar12) = iVar17;
                  ImVector<ImGuiListClipperRange>::erase
                            (this_00,(ImGuiListClipperRange *)
                                     (*(long *)((long)pvVar6 + 0x20) + lVar14));
                }
              } while( true );
            }
            goto LAB_001bbc38;
          }
          local_48.Max = *(int *)((long)pvVar6 + 0x10) + 1;
          local_48.Min = *(int *)((long)pvVar6 + 0x10);
          local_48.PosToIndexConvert = false;
          local_48.PosToIndexOffsetMin = '\0';
          local_48.PosToIndexOffsetMax = '\0';
          local_48._11_1_ = 0;
          ImVector<ImGuiListClipperRange>::push_front
                    ((ImVector<ImGuiListClipperRange> *)((long)pvVar6 + 0x18),&local_48);
          iVar18 = *(int *)((long)pvVar6 + 0x10);
          if (*(int *)((long)pvVar6 + 0x10) < **(int **)((long)pvVar6 + 0x20)) {
            iVar18 = **(int **)((long)pvVar6 + 0x20);
          }
          this->DisplayStart = iVar18;
          iVar18 = *(int *)(*(long *)((long)pvVar6 + 0x20) + 4);
          iVar20 = this->ItemsCount;
          if (iVar18 < this->ItemsCount) {
            iVar20 = iVar18;
          }
          this->DisplayEnd = iVar20;
          *(undefined4 *)((long)pvVar6 + 0xc) = 1;
        }
        else {
          iVar20 = *(int *)((long)pvVar6 + 0x10);
          this->DisplayStart = iVar20;
          iVar17 = iVar20 + 1;
          if (iVar18 <= iVar20 + 1) {
            iVar17 = iVar18;
          }
          this->DisplayEnd = iVar17;
          if (iVar20 < iVar18) {
            *(int *)((long)pvVar6 + 0x10) = *(int *)((long)pvVar6 + 0x10) + 1;
          }
        }
      }
      else {
        fVar24 = this->ItemsHeight;
        if (iVar20 == 0) goto LAB_001bb868;
        if (fVar24 <= 0.0) {
          iVar17 = this->DisplayEnd;
          this->ItemsHeight =
               ((window->DC).CursorPos.y - this->StartPosY) / (float)(iVar17 - this->DisplayStart);
          if ((16777216.0 <= ABS(this->StartPosY)) || (16777216.0 <= ABS((window->DC).CursorPos.y)))
          {
            this->ItemsHeight = (window->DC).PrevLineSize.y + (pIVar11->Style).ItemSpacing.y;
          }
          goto LAB_001bb978;
        }
        iVar17 = this->DisplayEnd;
        iVar18 = *(int *)((long)pvVar6 + 0x18);
LAB_001bbc38:
        if (iVar18 <= iVar20) {
          if (this->ItemsCount != 0x7fffffff) {
            ImGuiListClipper_SeekCursorForItem(this,this->ItemsCount);
          }
          bVar23 = false;
          goto LAB_001bbca9;
        }
        iVar18 = *(int *)(*(long *)((long)pvVar6 + 0x20) + (long)iVar20 * 0xc);
        iVar20 = iVar17;
        if (iVar17 < iVar18) {
          iVar20 = iVar18;
        }
        this->DisplayStart = iVar20;
        iVar19 = *(int *)(*(long *)((long)pvVar6 + 0x20) + 4 +
                         (long)*(int *)((long)pvVar6 + 0xc) * 0xc);
        iVar16 = this->ItemsCount;
        if (iVar19 < this->ItemsCount) {
          iVar16 = iVar19;
        }
        this->DisplayEnd = iVar16;
        if (iVar17 < iVar18) {
          ImGuiListClipper_SeekCursorForItem(this,iVar20);
        }
        *(int *)((long)pvVar6 + 0xc) = *(int *)((long)pvVar6 + 0xc) + 1;
      }
      bVar23 = this->DisplayStart != this->DisplayEnd;
      goto LAB_001bbca9;
    }
  }
  bVar23 = false;
LAB_001bbca9:
  if (((pIVar11->CurrentTable != (ImGuiTable *)0x0) &&
      (pIVar11->CurrentTable->IsUnfrozenRows == false)) && ((pIVar11->DebugLogFlags & 0x10) != 0)) {
    ImGui::DebugLog("Clipper: Step(): inside frozen table row.\n");
  }
  if (((local_34 <= 0.0) && (0.0 < this->ItemsHeight)) && ((pIVar11->DebugLogFlags & 0x10) != 0)) {
    ImGui::DebugLog("Clipper: Step(): computed ItemsHeight: %.2f.\n",(double)this->ItemsHeight);
  }
  if (bVar23 == false) {
    if ((pIVar11->DebugLogFlags & 0x10U) != 0) {
      ImGui::DebugLog("Clipper: Step(): End.\n");
    }
    End(this);
  }
  else if ((pIVar11->DebugLogFlags & 0x10U) != 0) {
    ImGui::DebugLog("Clipper: Step(): display %d to %d.\n",(ulong)(uint)this->DisplayStart,
                    (ulong)(uint)this->DisplayEnd);
  }
  return bVar23;
}

Assistant:

bool ImGuiListClipper::Step()
{
    ImGuiContext& g = *GImGui;
    bool need_items_height = (ItemsHeight <= 0.0f);
    bool ret = ImGuiListClipper_StepInternal(this);
    if (ret && (DisplayStart == DisplayEnd))
        ret = false;
    if (g.CurrentTable && g.CurrentTable->IsUnfrozenRows == false)
        IMGUI_DEBUG_LOG_CLIPPER("Clipper: Step(): inside frozen table row.\n");
    if (need_items_height && ItemsHeight > 0.0f)
        IMGUI_DEBUG_LOG_CLIPPER("Clipper: Step(): computed ItemsHeight: %.2f.\n", ItemsHeight);
    if (ret)
        IMGUI_DEBUG_LOG_CLIPPER("Clipper: Step(): display %d to %d.\n", DisplayStart, DisplayEnd);
    else
        IMGUI_DEBUG_LOG_CLIPPER("Clipper: Step(): End.\n");
    if (!ret)
        End();
    return ret;
}